

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

void __thiscall
VW::config::base_option::base_option(base_option *this,string *name,size_t type_hash)

{
  allocator local_1a;
  allocator local_19;
  
  this->_vptr_base_option = (_func_int **)&PTR__base_option_002ad058;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  this->m_type_hash = type_hash;
  std::__cxx11::string::string((string *)&this->m_help,"",&local_19);
  std::__cxx11::string::string((string *)&this->m_short_name,"",&local_1a);
  this->m_keep = false;
  return;
}

Assistant:

base_option(std::string name, size_t type_hash) : m_name(name), m_type_hash(type_hash) {}